

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::ForceManager::longRangeInteractions(ForceManager *this)

{
  InteractionData *idat;
  SelfData *sdat;
  bool *pbVar1;
  double dVar2;
  CutoffMethod CVar3;
  uint uVar4;
  uint uVar5;
  Snapshot *pSVar6;
  ForceDecomposition *pFVar7;
  pointer pdVar8;
  Vector3d *v2;
  long lVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  undefined4 extraout_var;
  pointer piVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar15;
  Vector<double,_3U> *v;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Molecule *pMVar16;
  SimInfo *pSVar17;
  uint *puVar18;
  long lVar19;
  uint atom1_1;
  uint atom1;
  uint uVar20;
  CutoffGroup *this_00;
  long lVar21;
  pointer ppCVar22;
  Vector3d *v1;
  uint *puVar23;
  vector<int,_std::allocator<int>_> atomListRow;
  vector<int,_std::allocator<int>_> atomListColumn;
  Vector3d fg;
  RealType surfacePotential;
  RealType reciprocalPotential;
  RealType rgrpsq;
  Vector3d d_grp;
  RealType dswdr;
  RealType rgrp;
  Vector3d vel2;
  MoleculeIterator mi;
  Mat3x3d bbox;
  Vector3d dag;
  Vector3d fij;
  Vector3d gvel2;
  potVec selectionPotential;
  potVec selfPotential;
  potVec longRangePotential;
  Vector3d f1;
  uint local_4d4;
  _Vector_base<int,_std::allocator<int>_> local_498;
  vector<int,_std::allocator<int>_> *local_478;
  Mat3x3d *local_470;
  SelectionManager *local_468;
  double local_460;
  _Vector_base<int,_std::allocator<int>_> local_458;
  Vector<double,_3U> local_440;
  Vector3d *local_428;
  uint local_41c;
  uint *local_418;
  ulong uStack_410;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_400;
  long local_3f8;
  Snapshot *local_3f0;
  RealType local_3e8;
  RealType local_3e0;
  double local_3d8;
  Vector<double,_3U> local_3d0;
  vector<int,_std::allocator<int>_> *local_3b8;
  RealType *local_3b0;
  Vector3d *local_3a8;
  Vector3d *local_3a0;
  RealType *local_398;
  RealType *local_390;
  potVec *local_388;
  potVec *local_380;
  potVec *local_378;
  double local_370;
  double local_368;
  Vector<double,_3U> local_360;
  MoleculeIterator local_348;
  RectMatrix<double,_3U,_3U> local_340;
  Vector<double,_3U> local_2f8;
  Vector<double,_7U> local_2e0;
  Vector<double,_3U> local_2a8;
  _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_290;
  Vector<double,_3U> local_278;
  Vector<double,_3U> local_260;
  Vector<double,_3U> local_248;
  Vector<double,_3U> local_230;
  Vector<double,_3U> local_218;
  Vector<double,_3U> local_200;
  Vector<double,_3U> local_1e8;
  Vector<double,_7U> local_1d0;
  Vector<double,_7U> local_198;
  Vector<double,_7U> local_160;
  Vector<double,_3U> local_128;
  Vector<double,_7U> local_110;
  Vector<double,_7U> local_d8;
  Vector<double,_7U> local_a0;
  Vector<double,_7U> local_68;
  undefined4 extraout_var_02;
  
  pSVar6 = this->info_->sman_->currentSnapshot_;
  (*this->fDecomp_->_vptr_ForceDecomposition[2])(this->fDecomp_,pSVar6);
  local_348._M_node = (_Base_ptr)0x0;
  pSVar17 = this->info_;
  local_3f0 = pSVar6;
  if (pSVar17->nCutoffGroups_ == pSVar17->nAtoms_) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (&(pSVar6->cgData).position,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)pSVar6)
    ;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (&(pSVar6->cgData).velocity,&(pSVar6->atomData).velocity);
  }
  else {
    pMVar16 = SimInfo::beginMolecule(pSVar17,&local_348);
    while (pMVar16 != (Molecule *)0x0) {
      ppCVar22 = (pMVar16->cutoffGroups_).
                 super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppCVar22 !=
          (pMVar16->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_001dd127;
      this_00 = (CutoffGroup *)0x0;
      while (this_00 != (CutoffGroup *)0x0) {
        CutoffGroup::updateCOM(this_00);
        ppCVar22 = ppCVar22 + 1;
        this_00 = (CutoffGroup *)0x0;
        if (ppCVar22 !=
            (pMVar16->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_001dd127:
          this_00 = *ppCVar22;
        }
      }
      pMVar16 = SimInfo::nextMolecule(this->info_,&local_348);
    }
  }
  (*this->fDecomp_->_vptr_ForceDecomposition[5])();
  (*this->fDecomp_->_vptr_ForceDecomposition[4])();
  Vector<double,_3U>::Vector(&local_3d0);
  Vector<double,_3U>::Vector(&local_2f8);
  Vector<double,_3U>::Vector(&local_278);
  Vector<double,_3U>::Vector(&local_360);
  Vector<double,_3U>::Vector(&local_2a8);
  Vector<double,_3U>::Vector(&local_440);
  Vector<double,_3U>::Vector(&local_128);
  local_458._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_498._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340.data_[0][0] = 0.0;
  Vector<double,_7U>::Vector(&local_160,(double *)&local_340);
  local_340.data_[0][0] = 0.0;
  Vector<double,_7U>::Vector(&local_198,(double *)&local_340);
  local_3e0 = 0.0;
  local_3e8 = 0.0;
  local_340.data_[0][0] = 0.0;
  Vector<double,_7U>::Vector(&local_1d0,(double *)&local_340);
  idat = &this->idat;
  (this->idat).rcut = this->rCut_;
  CVar3 = this->cutoffMethod_;
  (this->idat).shiftedPot = CVar3 == SHIFTED_POTENTIAL;
  (this->idat).shiftedForce = CVar3 - SHIFTED_FORCE < 2;
  bVar10 = this->doParticlePot_;
  (this->idat).doParticlePot = bVar10;
  bVar11 = this->doSitePotential_;
  (this->idat).doElectricField = this->doElectricField_;
  (this->idat).doSitePotential = bVar11;
  sdat = &this->sdat;
  (this->sdat).doParticlePot = bVar10;
  local_41c = this->info_->requiresPrepair_ ^ 1;
  local_400 = &this->savedPositions_;
  local_3b8 = &this->neighborList_;
  local_478 = &this->point_;
  local_3a0 = &(this->idat).eField1;
  local_3a8 = &(this->idat).eField2;
  local_3b0 = &(this->idat).sPot1;
  local_398 = &(this->idat).sw;
  local_468 = &this->seleMan_;
  local_378 = &(this->idat).pot;
  local_380 = &(this->idat).excludedPot;
  local_388 = &(this->idat).selePot;
  local_428 = &(this->idat).f1;
  local_460 = 0.0;
  local_390 = &(this->idat).dVdFQ1;
  v1 = &(this->idat).d;
  local_470 = &this->virialTensor;
  uVar13 = local_41c;
  do {
    if (uVar13 == 2) {
      (*this->fDecomp_->_vptr_ForceDecomposition[8])();
      pSVar6 = local_3f0;
      if (this->cutoffMethod_ == EWALD_FULL) {
        InteractionManager::doReciprocalSpaceSum(this->interactionMan_,&local_3e0);
        Snapshot::setReciprocalPotential(pSVar6,local_3e0);
      }
      if (this->useSurfaceTerm_ == true) {
        InteractionManager::doSurfaceTerm
                  (this->interactionMan_,this->useSlabGeometry_,this->axis_,&local_3e8);
        Snapshot::setSurfacePotential(pSVar6,local_3e8);
      }
      pSVar17 = this->info_;
      if (pSVar17->requiresSelfCorrection_ == true) {
        for (uVar13 = 0; uVar13 < (uint)pSVar17->nAtoms_; uVar13 = uVar13 + 1) {
          if (this->doPotentialSelection_ == true) {
            iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x21])(this->fDecomp_,(ulong)uVar13)
            ;
            bVar10 = SelectionManager::isGlobalIDSelected(local_468,iVar12);
            (this->sdat).isSelected = bVar10;
          }
          (*this->fDecomp_->_vptr_ForceDecomposition[0x29])(this->fDecomp_,sdat,(ulong)uVar13);
          InteractionManager::doSelfCorrection(this->interactionMan_,sdat);
          (*this->fDecomp_->_vptr_ForceDecomposition[0x2a])(this->fDecomp_,sdat,(ulong)uVar13);
          pSVar17 = this->info_;
        }
      }
      (*this->fDecomp_->_vptr_ForceDecomposition[9])();
      (*this->fDecomp_->_vptr_ForceDecomposition[0xb])(&local_340);
      Vector<double,_7U>::operator=(&local_160,(Vector<double,_7U> *)&local_340);
      Vector<double,_7U>::Vector(&local_68,&local_160);
      Snapshot::setLongRangePotentials(pSVar6,&local_68);
      (*this->fDecomp_->_vptr_ForceDecomposition[10])(&local_340);
      Vector<double,_7U>::operator=(&local_198,(Vector<double,_7U> *)&local_340);
      Vector<double,_7U>::Vector(&local_a0,&local_198);
      Snapshot::setSelfPotentials(pSVar6,&local_a0);
      (*this->fDecomp_->_vptr_ForceDecomposition[0xe])(&local_340);
      (*this->fDecomp_->_vptr_ForceDecomposition[0xc])(&local_2e0);
      OpenMD::operator+(&local_d8,(Vector<double,_7U> *)&local_340,&local_2e0);
      Snapshot::setExcludedPotentials(pSVar6,&local_d8);
      if (this->doPotentialSelection_ == true) {
        Snapshot::getSelectionPotentials((potVec *)&local_340,pSVar6);
        Vector<double,_7U>::operator=(&local_1d0,(Vector<double,_7U> *)&local_340);
        (*this->fDecomp_->_vptr_ForceDecomposition[0xf])(&local_340);
        Vector<double,_7U>::add(&local_1d0,(Vector<double,_7U> *)&local_340);
        (*this->fDecomp_->_vptr_ForceDecomposition[0xd])(&local_340);
        Vector<double,_7U>::add(&local_1d0,(Vector<double,_7U> *)&local_340);
        Vector<double,_7U>::Vector(&local_110,&local_1d0);
        Snapshot::setSelectionPotentials(pSVar6,&local_110);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_498);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_458);
      return;
    }
    if (uVar13 == local_41c) {
      pFVar7 = this->fDecomp_;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 &local_290,local_400);
      iVar12 = (*pFVar7->_vptr_ForceDecomposition[0x10])(pFVar7,&local_290);
      std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
      ~_Vector_base(&local_290);
      if ((char)iVar12 != '\0') {
        if (this->usePeriodicBoundaryConditions_ == false) {
          Thermo::getBoundingBox((Mat3x3d *)&local_340,this->thermo);
        }
        (*this->fDecomp_->_vptr_ForceDecomposition[0x11])
                  (this->fDecomp_,local_3b8,local_478,local_400);
      }
    }
    piVar14 = (local_478->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar9 = 0;
    while (lVar19 = lVar9,
          lVar19 < ((long)(this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar14) * 0x40000000 +
                   -0x100000000 >> 0x20) {
      iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x13])(this->fDecomp_,lVar19);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&local_498,
                 (vector<int,_std::allocator<int>_> *)CONCAT44(extraout_var,iVar12));
      piVar14 = (local_478->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_3f8 = lVar19 + 1;
      local_4d4 = 1;
      for (lVar21 = (long)piVar14[lVar19]; lVar9 = local_3f8, lVar21 < piVar14[local_3f8];
          lVar21 = lVar21 + 1) {
        uVar20 = (this->neighborList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar21];
        (*this->fDecomp_->_vptr_ForceDecomposition[0x19])(&local_340,this->fDecomp_,lVar19);
        Vector<double,_3U>::operator=(&local_3d0,(Vector<double,_3U> *)&local_340);
        local_3d8 = Vector<double,_3U>::lengthSquare(&local_3d0);
        if (local_3d8 < this->rCutSq_) {
          if (uVar13 == 1) {
            Vector<double,_3U>::zero(&local_2a8);
            Vector<double,_3U>::zero(&local_3a0->super_Vector<double,_3U>);
            Vector<double,_3U>::zero(&local_3a8->super_Vector<double,_3U>);
            *local_3b0 = 0.0;
            local_3b0[1] = 0.0;
            local_460 = 0.0;
          }
          bVar10 = SwitchingFunction::getSwitch
                             (this->switcher_,&local_3d8,local_398,&local_370,&local_368);
          iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x14])(this->fDecomp_,(ulong)uVar20);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)&local_458,
                     (vector<int,_std::allocator<int>_> *)CONCAT44(extraout_var_00,iVar12));
          puVar18 = (uint *)local_498._M_impl.super__Vector_impl_data._M_start;
          if (this->doHeatFlux_ == true) {
            iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x12])(this->fDecomp_,(ulong)uVar20)
            ;
            Vector<double,_3U>::operator=
                      (&local_278,(Vector<double,_3U> *)CONCAT44(extraout_var_01,iVar12));
            puVar18 = (uint *)local_498._M_impl.super__Vector_impl_data._M_start;
          }
          while (puVar18 != (uint *)local_498._M_impl.super__Vector_impl_data._M_finish) {
            uVar4 = *puVar18;
            uVar15 = (long)local_498._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_498._M_impl.super__Vector_impl_data._M_start;
            if (this->doPotentialSelection_ == true) {
              iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x1f])
                                 (this->fDecomp_,(ulong)uVar4);
              bVar11 = SelectionManager::isGlobalIDSelected(local_468,iVar12);
              (this->idat).isSelected = bVar11;
            }
            local_4d4 = (uint)(4 < uVar15 | (byte)local_4d4);
            local_418 = puVar18;
            for (puVar23 = (uint *)local_458._M_impl.super__Vector_impl_data._M_start;
                puVar23 != (uint *)local_458._M_impl.super__Vector_impl_data._M_finish;
                puVar23 = puVar23 + 1) {
              uVar5 = *puVar23;
              uVar15 = (ulong)uVar5;
              if (this->doPotentialSelection_ == true) {
                iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x20])(this->fDecomp_,uVar15);
                bVar11 = SelectionManager::isGlobalIDSelected(local_468,iVar12);
                pbVar1 = &(this->idat).isSelected;
                *pbVar1 = (bool)(*pbVar1 | bVar11);
              }
              iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x1d])
                                 (this->fDecomp_,(ulong)uVar4,uVar15,lVar19,(ulong)uVar20);
              if ((char)iVar12 == '\0') {
                (this->idat).vpair = 0.0;
                local_2e0.data_[0] = 0.0;
                Vector<double,_7U>::Vector((Vector<double,_7U> *)&local_340,local_2e0.data_);
                Vector<double,_7U>::operator=(local_378,(Vector<double,_7U> *)&local_340);
                local_2e0.data_[0] = 0.0;
                Vector<double,_7U>::Vector((Vector<double,_7U> *)&local_340,local_2e0.data_);
                Vector<double,_7U>::operator=(local_380,(Vector<double,_7U> *)&local_340);
                local_2e0.data_[0] = 0.0;
                Vector<double,_7U>::Vector((Vector<double,_7U> *)&local_340,local_2e0.data_);
                Vector<double,_7U>::operator=(local_388,(Vector<double,_7U> *)&local_340);
                Vector<double,_3U>::zero(&local_428->super_Vector<double,_3U>);
                *local_390 = 0.0;
                local_390[1] = 0.0;
                (*this->fDecomp_->_vptr_ForceDecomposition[0x26])
                          (this->fDecomp_,idat,(ulong)uVar4,uVar15,(ulong)local_4d4);
                iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x22])
                                   (this->fDecomp_,(ulong)uVar4,(ulong)uVar5);
                (this->idat).topoDist = iVar12;
                pdVar8 = (this->electrostaticScale_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                (this->idat).vdwMult =
                     (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar12];
                (this->idat).electroMult = pdVar8[iVar12];
                if (((long)local_498._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_498._M_impl.super__Vector_impl_data._M_start == 4) &&
                   ((long)local_458._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_458._M_impl.super__Vector_impl_data._M_start == 4)) {
                  Vector<double,_3U>::operator=(&v1->super_Vector<double,_3U>,&local_3d0);
                  (this->idat).r2 = local_3d8;
                  v = &local_278;
                  if (this->doHeatFlux_ == true) {
LAB_001dca65:
                    Vector<double,_3U>::operator=(&local_360,v);
                  }
                }
                else {
                  (*this->fDecomp_->_vptr_ForceDecomposition[0x1a])
                            (&local_340,this->fDecomp_,(ulong)uVar4,(ulong)uVar5);
                  Vector<double,_3U>::operator=
                            (&v1->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_340);
                  Snapshot::wrapVector(local_3f0,v1);
                  dVar2 = Vector<double,_3U>::lengthSquare(&v1->super_Vector<double,_3U>);
                  (this->idat).r2 = dVar2;
                  if (this->doHeatFlux_ == true) {
                    iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x25])
                                       (this->fDecomp_,(ulong)uVar5);
                    v = (Vector<double,_3U> *)CONCAT44(extraout_var_02,iVar12);
                    goto LAB_001dca65;
                  }
                }
                dVar2 = (this->idat).r2;
                if (dVar2 < 0.0) {
                  dVar2 = sqrt(dVar2);
                }
                else {
                  dVar2 = SQRT(dVar2);
                }
                (this->idat).rij = dVar2;
                if (uVar13 == 0) {
                  InteractionManager::doPrePair(this->interactionMan_,idat);
                  (*this->fDecomp_->_vptr_ForceDecomposition[0x27])
                            (this->fDecomp_,idat,(ulong)uVar4,uVar15);
                }
                else {
                  InteractionManager::doPair(this->interactionMan_,idat);
                  (*this->fDecomp_->_vptr_ForceDecomposition[0x28])
                            (this->fDecomp_,idat,(ulong)uVar4,uVar15);
                  v2 = local_428;
                  local_460 = local_460 + (this->idat).vpair;
                  Vector<double,_3U>::add(&local_2a8,&local_428->super_Vector<double,_3U>);
                  outProduct<double>((SquareMatrix3<double> *)&local_340,v1,v2);
                  RectMatrix<double,_3U,_3U>::sub
                            ((RectMatrix<double,_3U,_3U> *)local_470,&local_340);
                  if (this->doHeatFlux_ == true) {
                    pFVar7 = this->fDecomp_;
                    dVar2 = dot<double,3u>(&local_428->super_Vector<double,_3U>,&local_360);
                    operator*((Vector<double,_3U> *)&local_340,&v1->super_Vector<double,_3U>,dVar2);
                    Vector<double,_3U>::Vector(&local_1e8,(Vector<double,_3U> *)&local_340);
                    (*pFVar7->_vptr_ForceDecomposition[0x2d])(pFVar7,&local_1e8);
                  }
                }
                local_4d4 = 0;
              }
            }
            puVar18 = local_418 + 1;
          }
          if (bVar10 && uVar13 == 1) {
            local_418 = (uint *)((local_370 * local_460) / local_368);
            uStack_410 = 0;
            operator*((Vector<double,_3U> *)&local_340,(double)local_418,&local_3d0);
            Vector3<double>::operator=
                      ((Vector3<double> *)&local_440,(Vector<double,_3U> *)&local_340);
            Vector<double,_3U>::add(&local_2a8,&local_440);
            puVar18 = (uint *)local_498._M_impl.super__Vector_impl_data._M_start;
            if ((((long)local_498._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_498._M_impl.super__Vector_impl_data._M_start == 4) &&
                ((long)local_458._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_458._M_impl.super__Vector_impl_data._M_start == 4)) &&
               (iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x1d])
                                   (this->fDecomp_,
                                    (ulong)(uint)*local_498._M_impl.super__Vector_impl_data._M_start
                                    ,(ulong)(uint)*local_458._M_impl.super__Vector_impl_data.
                                                   _M_start,lVar19,(ulong)uVar20),
               puVar18 = (uint *)local_498._M_impl.super__Vector_impl_data._M_start,
               (char)iVar12 == '\0')) {
              outProduct<double>((SquareMatrix3<double> *)&local_340,v1,
                                 (Vector3<double> *)&local_440);
              RectMatrix<double,_3U,_3U>::sub((RectMatrix<double,_3U,_3U> *)local_470,&local_340);
              puVar18 = (uint *)local_498._M_impl.super__Vector_impl_data._M_start;
              if (this->doHeatFlux_ == true) {
                pFVar7 = this->fDecomp_;
                dVar2 = dot<double,3u>(&local_440,&local_360);
                operator*((Vector<double,_3U> *)&local_340,&v1->super_Vector<double,_3U>,dVar2);
                Vector<double,_3U>::Vector(&local_200,(Vector<double,_3U> *)&local_340);
                (*pFVar7->_vptr_ForceDecomposition[0x2d])(pFVar7,&local_200);
                puVar18 = (uint *)local_498._M_impl.super__Vector_impl_data._M_start;
              }
            }
            for (; puVar18 != (uint *)local_498._M_impl.super__Vector_impl_data._M_finish;
                puVar18 = puVar18 + 1) {
              uVar4 = *puVar18;
              iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x17])
                                 (this->fDecomp_,(ulong)uVar4);
              dVar2 = *(double *)CONCAT44(extraout_var_03,iVar12);
              operator*((Vector<double,_3U> *)&local_2e0,(double)local_418,&local_3d0);
              operator*((Vector<double,_3U> *)&local_340,(Vector<double,_3U> *)&local_2e0,dVar2);
              Vector3<double>::operator=
                        ((Vector3<double> *)&local_440,(Vector<double,_3U> *)&local_340);
              pFVar7 = this->fDecomp_;
              Vector<double,_3U>::Vector(&local_218,&local_440);
              (*pFVar7->_vptr_ForceDecomposition[0x23])(pFVar7,(ulong)uVar4,&local_218);
              if ((4 < (ulong)((long)local_498._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_498._M_impl.super__Vector_impl_data._M_start)) &&
                 (this->info_->usesAtomicVirial_ == true)) {
                (*this->fDecomp_->_vptr_ForceDecomposition[0x15])
                          (&local_340,this->fDecomp_,(ulong)uVar4,lVar19);
                Vector<double,_3U>::operator=(&local_2f8,(Vector<double,_3U> *)&local_340);
                outProduct<double>((SquareMatrix3<double> *)&local_340,(Vector3<double> *)&local_2f8
                                   ,(Vector3<double> *)&local_440);
                RectMatrix<double,_3U,_3U>::sub((RectMatrix<double,_3U,_3U> *)local_470,&local_340);
                if (this->doHeatFlux_ == true) {
                  pFVar7 = this->fDecomp_;
                  dVar2 = dot<double,3u>(&local_440,&local_360);
                  operator*((Vector<double,_3U> *)&local_340,&local_2f8,dVar2);
                  Vector<double,_3U>::Vector(&local_230,(Vector<double,_3U> *)&local_340);
                  (*pFVar7->_vptr_ForceDecomposition[0x2d])(pFVar7,&local_230);
                }
              }
            }
            local_418 = (uint *)((ulong)local_418 ^ 0x8000000000000000);
            uStack_410 = uStack_410 ^ 0x8000000000000000;
            for (puVar18 = (uint *)local_458._M_impl.super__Vector_impl_data._M_start;
                puVar18 != (uint *)local_458._M_impl.super__Vector_impl_data._M_finish;
                puVar18 = puVar18 + 1) {
              uVar4 = *puVar18;
              iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x18])
                                 (this->fDecomp_,(ulong)uVar4);
              dVar2 = *(double *)CONCAT44(extraout_var_04,iVar12);
              operator*((Vector<double,_3U> *)&local_2e0,(double)local_418,&local_3d0);
              operator*((Vector<double,_3U> *)&local_340,(Vector<double,_3U> *)&local_2e0,dVar2);
              Vector3<double>::operator=
                        ((Vector3<double> *)&local_440,(Vector<double,_3U> *)&local_340);
              pFVar7 = this->fDecomp_;
              Vector<double,_3U>::Vector(&local_248,&local_440);
              (*pFVar7->_vptr_ForceDecomposition[0x24])(pFVar7,(ulong)uVar4,&local_248);
              if ((4 < (ulong)((long)local_458._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_458._M_impl.super__Vector_impl_data._M_start)) &&
                 (this->info_->usesAtomicVirial_ == true)) {
                (*this->fDecomp_->_vptr_ForceDecomposition[0x16])
                          (&local_340,this->fDecomp_,(ulong)uVar4,(ulong)uVar20);
                Vector<double,_3U>::operator=(&local_2f8,(Vector<double,_3U> *)&local_340);
                outProduct<double>((SquareMatrix3<double> *)&local_340,(Vector3<double> *)&local_2f8
                                   ,(Vector3<double> *)&local_440);
                RectMatrix<double,_3U,_3U>::sub((RectMatrix<double,_3U,_3U> *)local_470,&local_340);
                if (this->doHeatFlux_ == true) {
                  pFVar7 = this->fDecomp_;
                  dVar2 = dot<double,3u>(&local_440,&local_360);
                  operator*((Vector<double,_3U> *)&local_340,&local_2f8,dVar2);
                  Vector<double,_3U>::Vector(&local_260,(Vector<double,_3U> *)&local_340);
                  (*pFVar7->_vptr_ForceDecomposition[0x2d])(pFVar7,&local_260);
                }
              }
            }
          }
        }
        piVar14 = (local_478->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
    }
    if ((uVar13 == 0) && (this->info_->requiresPrepair_ == true)) {
      (*this->fDecomp_->_vptr_ForceDecomposition[6])();
      for (uVar20 = 0; uVar20 < (uint)this->info_->nAtoms_; uVar20 = uVar20 + 1) {
        if (this->doPotentialSelection_ == true) {
          iVar12 = (*this->fDecomp_->_vptr_ForceDecomposition[0x21])(this->fDecomp_,(ulong)uVar20);
          bVar10 = SelectionManager::isGlobalIDSelected(local_468,iVar12);
          (this->sdat).isSelected = bVar10;
        }
        (*this->fDecomp_->_vptr_ForceDecomposition[0x2b])(this->fDecomp_,sdat,(ulong)uVar20);
        InteractionManager::doPreForce(this->interactionMan_,sdat);
        (*this->fDecomp_->_vptr_ForceDecomposition[0x2c])(this->fDecomp_,sdat,(ulong)uVar20);
      }
      (*this->fDecomp_->_vptr_ForceDecomposition[7])();
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void ForceManager::longRangeInteractions() {
    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    fDecomp_->setSnapshot(curSnapshot);

    DataStorage* config   = &(curSnapshot->atomData);
    DataStorage* cgConfig = &(curSnapshot->cgData);

    // calculate the center of mass of cutoff group

    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    if (info_->getNCutoffGroups() != info_->getNAtoms()) {
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          cg->updateCOM();
        }
      }
    } else {
      // center of mass of the group is the same as position of the atom
      // if cutoff group does not exist
      cgConfig->position = config->position;
      cgConfig->velocity = config->velocity;
    }

    fDecomp_->zeroWorkArrays();
    fDecomp_->distributeData();

    int cg1, cg2, atom1, atom2;
    Vector3d d_grp, dag, gvel2, vel2;
    RealType rgrpsq, rgrp;
    RealType vij(0.0);
    Vector3d fij, fg, f1;
    bool in_switching_region;
    RealType dswdr, swderiv;
    vector<int> atomListColumn, atomListRow;

    potVec longRangePotential(0.0);
    potVec selfPotential(0.0);
    RealType reciprocalPotential(0.0);
    RealType surfacePotential(0.0);
    potVec selectionPotential(0.0);

    RealType mf;
    bool newAtom1;
    int gid1, gid2;

    vector<int>::iterator ia, jb;

    int loopStart, loopEnd;

    idat.rcut       = rCut_;
    idat.shiftedPot = (cutoffMethod_ == SHIFTED_POTENTIAL) ? true : false;
    idat.shiftedForce =
        (cutoffMethod_ == SHIFTED_FORCE || cutoffMethod_ == TAYLOR_SHIFTED) ?
            true :
            false;
    idat.doParticlePot   = doParticlePot_;
    idat.doElectricField = doElectricField_;
    idat.doSitePotential = doSitePotential_;
    sdat.doParticlePot   = doParticlePot_;

    loopEnd = PAIR_LOOP;
    if (info_->requiresPrepair()) {
      loopStart = PREPAIR_LOOP;
    } else {
      loopStart = PAIR_LOOP;
    }
    for (int iLoop = loopStart; iLoop <= loopEnd; iLoop++) {
      if (iLoop == loopStart) {
        bool update_nlist = fDecomp_->checkNeighborList(savedPositions_);

        if (update_nlist) {
          if (!usePeriodicBoundaryConditions_)
            Mat3x3d bbox = thermo->getBoundingBox();
          fDecomp_->buildNeighborList(neighborList_, point_, savedPositions_);
        }
      }

      for (cg1 = 0; cg1 < int(point_.size()) - 1; cg1++) {
        atomListRow = fDecomp_->getAtomsInGroupRow(cg1);
        newAtom1    = true;

        for (int m2 = point_[cg1]; m2 < point_[cg1 + 1]; m2++) {
          cg2 = neighborList_[m2];

          d_grp = fDecomp_->getIntergroupVector(cg1, cg2);

          // already wrapped in the getIntergroupVector call:
          // curSnapshot->wrapVector(d_grp);
          rgrpsq = d_grp.lengthSquare();

          if (rgrpsq < rCutSq_) {
            if (iLoop == PAIR_LOOP) {
              vij = 0.0;
              fij.zero();
              idat.eField1.zero();
              idat.eField2.zero();
              idat.sPot1 = 0.0;
              idat.sPot2 = 0.0;
            }

            in_switching_region =
                switcher_->getSwitch(rgrpsq, idat.sw, dswdr, rgrp);

            atomListColumn = fDecomp_->getAtomsInGroupColumn(cg2);

            if (doHeatFlux_) gvel2 = fDecomp_->getGroupVelocityColumn(cg2);

            for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
              atom1 = (*ia);
              if (atomListRow.size() > 1) newAtom1 = true;

              if (doPotentialSelection_) {
                gid1            = fDecomp_->getGlobalIDRow(atom1);
                idat.isSelected = seleMan_.isGlobalIDSelected(gid1);
              }

              for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                   ++jb) {
                atom2 = (*jb);

                if (doPotentialSelection_) {
                  gid2 = fDecomp_->getGlobalIDCol(atom2);
                  idat.isSelected |= seleMan_.isGlobalIDSelected(gid2);
                }

                if (!fDecomp_->skipAtomPair(atom1, atom2, cg1, cg2)) {
                  idat.vpair       = 0.0;
                  idat.pot         = 0.0;
                  idat.excludedPot = 0.0;
                  idat.selePot     = 0.0;
                  idat.f1.zero();
                  idat.dVdFQ1 = 0.0;
                  idat.dVdFQ2 = 0.0;

                  fDecomp_->fillInteractionData(idat, atom1, atom2, newAtom1);
                  newAtom1 = false;

                  idat.topoDist =
                      fDecomp_->getTopologicalDistance(atom1, atom2);
                  idat.vdwMult     = vdwScale_[idat.topoDist];
                  idat.electroMult = electrostaticScale_[idat.topoDist];

                  if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                    idat.d  = d_grp;
                    idat.r2 = rgrpsq;
                    if (doHeatFlux_) vel2 = gvel2;
                  } else {
                    idat.d = fDecomp_->getInteratomicVector(atom1, atom2);
                    curSnapshot->wrapVector(idat.d);
                    idat.r2 = idat.d.lengthSquare();
                    if (doHeatFlux_)
                      vel2 = fDecomp_->getAtomVelocityColumn(atom2);
                  }

                  idat.rij = sqrt(idat.r2);

                  if (iLoop == PREPAIR_LOOP) {
                    interactionMan_->doPrePair(idat);
                    fDecomp_->unpackPrePairData(idat, atom1, atom2);
                  } else {
                    interactionMan_->doPair(idat);
                    fDecomp_->unpackInteractionData(idat, atom1, atom2);
                    vij += idat.vpair;
                    fij += idat.f1;
                    virialTensor -= outProduct(idat.d, idat.f1);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(idat.f1, vel2));
                  }
                }
              }
            }

            if (iLoop == PAIR_LOOP) {
              if (in_switching_region) {
                swderiv = vij * dswdr / rgrp;
                fg      = swderiv * d_grp;
                fij += fg;

                if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                  if (!fDecomp_->skipAtomPair(atomListRow[0], atomListColumn[0],
                                              cg1, cg2)) {
                    virialTensor -= outProduct(idat.d, fg);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(fg, vel2));
                  }
                }

                for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
                  atom1 = (*ia);
                  mf    = fDecomp_->getMassFactorRow(atom1);
                  // fg is the force on atom ia due to cutoff group's
                  // presence in switching region
                  fg = swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomRow(atom1, fg);
                  if (atomListRow.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorRow(atom1, cg1);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
                for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                     ++jb) {
                  atom2 = (*jb);
                  mf    = fDecomp_->getMassFactorColumn(atom2);
                  // fg is the force on atom jb due to cutoff group's
                  // presence in switching region
                  fg = -swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomColumn(atom2, fg);

                  if (atomListColumn.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorColumn(atom2, cg2);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
              }
              // if (!info_->usesAtomicVirial()) {
              //  virialTensor -= outProduct(d_grp, fij);
              //  if (doHeatFlux_)
              //     fDecomp_->addToHeatFlux( d_grp * dot(fij, vel2));
              //}
            }
          }
        }
      }

      if (iLoop == PREPAIR_LOOP) {
        if (info_->requiresPrepair()) {
          fDecomp_->collectIntermediateData();

          for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
            if (doPotentialSelection_) {
              gid1            = fDecomp_->getGlobalID(atom1);
              sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
            }
            fDecomp_->fillPreForceData(sdat, atom1);
            interactionMan_->doPreForce(sdat);
            fDecomp_->unpackPreForceData(sdat, atom1);
          }

          fDecomp_->distributeIntermediateData();
        }
      }
    }

    // collects pairwise information
    fDecomp_->collectData();
    if (cutoffMethod_ == EWALD_FULL) {
      interactionMan_->doReciprocalSpaceSum(reciprocalPotential);
      curSnapshot->setReciprocalPotential(reciprocalPotential);
    }

    if (useSurfaceTerm_) {
      interactionMan_->doSurfaceTerm(useSlabGeometry_, axis_, surfacePotential);
      curSnapshot->setSurfacePotential(surfacePotential);
    }

    if (info_->requiresSelfCorrection()) {
      for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
        if (doPotentialSelection_) {
          gid1            = fDecomp_->getGlobalID(atom1);
          sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
        }
        fDecomp_->fillSelfData(sdat, atom1);
        interactionMan_->doSelfCorrection(sdat);
        fDecomp_->unpackSelfData(sdat, atom1);
      }
    }

    // collects single-atom information
    fDecomp_->collectSelfData();

    longRangePotential = fDecomp_->getPairwisePotential();
    curSnapshot->setLongRangePotentials(longRangePotential);

    selfPotential = fDecomp_->getSelfPotential();
    curSnapshot->setSelfPotentials(selfPotential);

    curSnapshot->setExcludedPotentials(fDecomp_->getExcludedSelfPotential() +
                                       fDecomp_->getExcludedPotential());

    if (doPotentialSelection_) {
      selectionPotential = curSnapshot->getSelectionPotentials();
      selectionPotential += fDecomp_->getSelectedSelfPotential();
      selectionPotential += fDecomp_->getSelectedPotential();
      curSnapshot->setSelectionPotentials(selectionPotential);
    }
  }